

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTSIZEDec2(octet *der,size_t count,u32 tag,size_t val)

{
  size_t sVar1;
  size_t v;
  undefined4 in_stack_00000010;
  
  sVar1 = derTSIZEDec((size_t *)count,(octet *)CONCAT44(tag,in_stack_00000010),val,v._4_4_);
  return sVar1;
}

Assistant:

size_t derTSIZEDec2(const octet der[], size_t count, u32 tag, size_t val)
{
	register size_t v = val;
	count = derTSIZEDec(&val, der, count, tag);
	if (v != val)
		count = SIZE_MAX;
	v = 0;
	return count;
}